

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

int Dar_ObjCutLevelAchieved(Vec_Ptr_t *vCut,int nLevelMin)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  int nLevelMin_local;
  Vec_Ptr_t *vCut_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vCut);
    if (iVar1 <= local_2c) {
      return 0;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_2c);
    iVar1 = Aig_ObjIsCi(pObj_00);
    if ((iVar1 == 0) &&
       ((int)((uint)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x20) & 0xffffff) <= nLevelMin))
    break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

int Dar_ObjCutLevelAchieved( Vec_Ptr_t * vCut, int nLevelMin )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( !Aig_ObjIsCi(pObj) && (int)pObj->Level <= nLevelMin )
            return 1;
    return 0;
}